

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall QDir::isEmpty(QDir *this,Filters filters)

{
  byte bVar1;
  QDirPrivate *pQVar2;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QDirPrivate *d;
  QDirListing dirList;
  QDirListing *in_stack_ffffffffffffff78;
  QDirListing *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QString *in_stack_ffffffffffffffc8;
  QDirListing *in_stack_ffffffffffffffd0;
  QFlags<QDir::Filter> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QDir *)0x281ecf);
  QFileSystemEntry::filePath
            ((QFileSystemEntry *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  QFlags<QDir::Filter>::toInt(&local_c);
  QDirListing::QDirListing
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_RDI,
             (uint)((ulong)pQVar2 >> 0x20),(uint)pQVar2);
  QString::~QString((QString *)0x281f38);
  QDirListing::cbegin(in_stack_ffffffffffffff78);
  QDirListing::cend(in_stack_ffffffffffffff80);
  bVar1 = ::operator==(&stack0xffffffffffffffc8);
  QDirListing::~QDirListing(in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::isEmpty(Filters filters) const
{
    Q_D(const QDir);
    QDirListing dirList(d->dirEntry.filePath(), d->nameFilters, filters.toInt());
    return dirList.cbegin() == dirList.cend();
}